

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O1

TestInstance * __thiscall
vkt::sr::anon_unknown_0::TextureQueryCase::createInstance(TextureQueryCase *this,Context *context)

{
  deInt32 *pdVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  iterator __position;
  TextureSpec *pTVar5;
  VkFormat format;
  uint uVar6;
  int iVar7;
  TextureChannelClass TVar8;
  TextureQueryInstance *pTVar9;
  InstanceInterface *pIVar10;
  VkPhysicalDevice pVVar11;
  TextureFormat TVar12;
  TextureQueryLodInstance *this_00;
  ulong uVar13;
  VkPhysicalDeviceProperties *pVVar14;
  NotSupportedError *this_01;
  IVec3 *pIVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  float fVar19;
  float fVar20;
  CubeFaceFloatCoords CVar21;
  CubeFaceFloatCoords CVar22;
  CubeFaceFloatCoords CVar23;
  TextureBindingSp textureBinding;
  IVec3 textureSize;
  float p;
  undefined8 in_stack_fffffffffffffdb8;
  value_type local_238;
  float local_21c;
  string local_218;
  IVec3 local_1f4;
  undefined1 local_1e8 [16];
  float local_1d0;
  float local_1cc;
  undefined1 local_1c8 [16];
  undefined1 local_1b0 [8];
  SharedPtrStateBase *local_1a8;
  VkSampleCountFlagBits local_19c;
  ios_base local_138 [264];
  
  uVar18 = (uint)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
  switch(this->m_function) {
  case QUERYFUNCTION_TEXTURESIZE:
    pTVar9 = (TextureQueryInstance *)operator_new(0x248);
    TextureQueryInstance::TextureQueryInstance
              (pTVar9,context,(this->super_ShaderRenderCase).m_isVertexCase,&this->m_textureSpec);
    (pTVar9->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance =
         (_func_int **)&PTR__ShaderRenderCaseInstance_00d26a88;
    *(undefined8 *)&pTVar9[1].super_ShaderRenderCaseInstance = 0;
    pTVar9[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context = (Context *)0x0;
    pTVar9[1].super_ShaderRenderCaseInstance.m_imageBackingMode = IMAGE_BACKING_MODE_REGULAR;
    pTVar9[1].super_ShaderRenderCaseInstance.m_quadGridSize = 0;
    *(undefined8 *)
     &pTVar9[1].super_ShaderRenderCaseInstance.m_sparseContext.
      super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
         = 0;
    *(undefined8 *)
     &pTVar9[1].super_ShaderRenderCaseInstance.m_sparseContext.
      super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
      .m_data.field_0x8 = 0;
    pTVar9[1].super_ShaderRenderCaseInstance.m_memAlloc = (Allocator *)0x0;
    break;
  case QUERYFUNCTION_TEXTUREQUERYLOD:
    this_00 = (TextureQueryLodInstance *)operator_new(0x248);
    TextureQueryInstance::TextureQueryInstance
              ((TextureQueryInstance *)this_00,context,(this->super_ShaderRenderCase).m_isVertexCase
               ,&this->m_textureSpec);
    (this_00->super_TextureQueryInstance).super_ShaderRenderCaseInstance.super_TestInstance.
    _vptr_TestInstance = (_func_int **)&PTR__ShaderRenderCaseInstance_00d26b48;
    (this_00->m_minCoord).m_data[0] = 0.0;
    (this_00->m_minCoord).m_data[1] = 0.0;
    (this_00->m_minCoord).m_data[2] = 0.0;
    (this_00->m_minCoord).m_data[3] = 0.0;
    (this_00->m_maxCoord).m_data[0] = 0.0;
    (this_00->m_maxCoord).m_data[1] = 0.0;
    (this_00->m_maxCoord).m_data[2] = 0.0;
    (this_00->m_maxCoord).m_data[3] = 0.0;
    *(undefined8 *)(this_00->m_lodBounds).m_data = 0;
    *(undefined8 *)(this_00->m_levelBounds).m_data = 0;
    local_1b0 = (undefined1  [8])
                ((this_00->super_TextureQueryInstance).super_ShaderRenderCaseInstance.
                 super_TestInstance.m_context)->m_testCtx->m_log;
    pTVar5 = (this_00->super_TextureQueryInstance).m_textureSpec;
    local_1f4.m_data[0] = pTVar5->width;
    local_1f4.m_data[1] = pTVar5->height;
    local_1f4.m_data[2] = pTVar5->depth;
    pIVar15 = (IVec3 *)(ulong)(uint)local_1f4.m_data[2];
    local_238.m_ptr = (TextureBinding *)0x0;
    local_238.m_state = (SharedPtrStateBase *)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Image size: ",0xc);
    sr::(anonymous_namespace)::getTextureSizeString_abi_cxx11_
              (&local_218,
               (_anonymous_namespace_ *)
               (ulong)((this_00->super_TextureQueryInstance).m_textureSpec)->type,
               (TextureType)&local_1f4,pIVar15);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               (char *)CONCAT44(local_218._M_dataplus._M_p._4_4_,(uint)local_218._M_dataplus._M_p),
               local_218._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_218._M_dataplus._M_p._4_4_,(uint)local_218._M_dataplus._M_p) !=
        &local_218.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_218._M_dataplus._M_p._4_4_,(uint)local_218._M_dataplus._M_p),
                      local_218.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    pTVar5 = (this_00->super_TextureQueryInstance).m_textureSpec;
    createEmptyTexture((anon_unknown_0 *)local_1b0,pTVar5->format,pTVar5->type,&local_1f4,
                       pTVar5->numLevels,0,&pTVar5->sampler);
    if (local_238.m_state != local_1a8) {
      if (local_238.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_238.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_238.m_ptr = (TextureBinding *)0x0;
          (*(local_238.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_238.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if ((*pdVar1 == 0) && (local_238.m_state != (SharedPtrStateBase *)0x0)) {
          (*(local_238.m_state)->_vptr_SharedPtrStateBase[1])();
        }
      }
      local_238.m_ptr = (TextureBinding *)local_1b0;
      local_238.m_state = local_1a8;
      if (local_1a8 != (SharedPtrStateBase *)0x0) {
        LOCK();
        local_1a8->strongRefCount = local_1a8->strongRefCount + 1;
        UNLOCK();
        LOCK();
        local_1a8->weakRefCount = local_1a8->weakRefCount + 1;
        UNLOCK();
      }
    }
    if (local_1a8 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &local_1a8->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_1b0._0_4_ = R;
        local_1b0._4_4_ = SNORM_INT8;
        (*local_1a8->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &local_1a8->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_1a8 != (SharedPtrStateBase *)0x0) {
          (*local_1a8->_vptr_SharedPtrStateBase[1])();
        }
        local_1a8 = (SharedPtrStateBase *)0x0;
      }
    }
    std::
    vector<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
    ::push_back(&(this_00->super_TextureQueryInstance).super_ShaderRenderCaseInstance.m_textures,
                &local_238);
    if (local_238.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_238.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_238.m_ptr = (TextureBinding *)0x0;
        (*(local_238.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_238.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_238.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_238.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_238.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    uVar13 = (ulong)((this_00->super_TextureQueryInstance).m_textureSpec)->type;
    if (uVar13 < 7) {
      fVar19 = *(float *)(&DAT_00b240c0 + uVar13 * 4);
      fVar20 = *(float *)(&DAT_00b240dc + uVar13 * 4);
      fVar2 = *(float *)(&DAT_00b240f8 + uVar13 * 4);
      fVar3 = *(float *)(&DAT_00b24114 + uVar13 * 4);
      fVar4 = *(float *)(&DAT_00b24130 + uVar13 * 4);
      (this_00->m_minCoord).m_data[0] = *(float *)(&DAT_00b240a4 + uVar13 * 4);
      (this_00->m_minCoord).m_data[1] = fVar19;
      (this_00->m_minCoord).m_data[2] = fVar20;
      (this_00->m_minCoord).m_data[3] = 0.0;
      (this_00->m_maxCoord).m_data[0] = fVar2;
      (this_00->m_maxCoord).m_data[1] = fVar3;
      (this_00->m_maxCoord).m_data[2] = fVar4;
      (this_00->m_maxCoord).m_data[3] = 0.0;
    }
    ShaderRenderCaseInstance::getViewportSize((ShaderRenderCaseInstance *)this_00);
    pVVar14 = Context::getDeviceProperties
                        ((this_00->super_TextureQueryInstance).super_ShaderRenderCaseInstance.
                         super_TestInstance.m_context);
    pTVar5 = (this_00->super_TextureQueryInstance).m_textureSpec;
    if (TEXTURETYPE_CUBE_ARRAY < pTVar5->type) goto LAB_0062dee3;
    local_21c = (float)((pVVar14->limits).mipmapPrecisionBits * -0x800000 + 0x3f800000) + 0.008;
    switch(pTVar5->type) {
    default:
      fVar19 = ((float)pTVar5->width *
               ((this_00->m_maxCoord).m_data[0] - (this_00->m_minCoord).m_data[0])) /
               (float)(uint)local_218._M_dataplus._M_p;
      uVar18 = -(uint)(-fVar19 <= fVar19);
      fVar19 = (float)(~uVar18 & (uint)-fVar19 | (uint)fVar19 & uVar18);
      fVar19 = (float)(-(uint)(0.0 <= fVar19) & (uint)fVar19);
      local_1e8 = ZEXT416((uint)fVar19);
      fVar19 = logf(fVar19);
      (this_00->m_lodBounds).m_data[0] = fVar19 * 1.442695 - local_21c;
      fVar19 = (float)local_1e8._0_4_;
      goto LAB_0062dec4;
    case TEXTURETYPE_2D:
    case TEXTURETYPE_2D_ARRAY:
      fVar20 = ((float)pTVar5->width *
               ((this_00->m_maxCoord).m_data[0] - (this_00->m_minCoord).m_data[0])) /
               (float)(uint)local_218._M_dataplus._M_p;
      fVar19 = ((float)pTVar5->height *
               ((this_00->m_maxCoord).m_data[1] - (this_00->m_minCoord).m_data[1])) /
               (float)local_218._M_dataplus._M_p._4_4_;
      uVar18 = -(uint)(-fVar20 <= fVar20);
      fVar20 = (float)(~uVar18 & (uint)-fVar20 | (uint)fVar20 & uVar18);
      fVar20 = (float)(-(uint)(0.0 <= fVar20) & (uint)fVar20);
      uVar18 = -(uint)(-fVar19 <= fVar19);
      fVar19 = (float)(~uVar18 & (uint)-fVar19 | (uint)fVar19 & uVar18);
      break;
    case TEXTURETYPE_3D:
      fVar19 = ((float)pTVar5->width *
               ((this_00->m_maxCoord).m_data[0] - (this_00->m_minCoord).m_data[0])) /
               (float)(uint)local_218._M_dataplus._M_p;
      local_1e8._0_4_ = fVar19;
      fVar20 = ((float)pTVar5->height *
               ((this_00->m_maxCoord).m_data[1] - (this_00->m_minCoord).m_data[1])) /
               (float)local_218._M_dataplus._M_p._4_4_;
      local_1c8._0_4_ = fVar20;
      local_1cc = (float)pTVar5->depth *
                  ((this_00->m_maxCoord).m_data[2] - (this_00->m_minCoord).m_data[2]) * 0.5;
      local_1d0 = local_1cc / (float)(uint)local_218._M_dataplus._M_p;
      local_1cc = local_1cc / (float)local_218._M_dataplus._M_p._4_4_;
      fVar19 = TextureTestUtil::computeLodFromDerivates
                         (LODMODE_MIN_BOUND,fVar19,0.0,local_1d0,0.0,fVar20,local_1cc);
      (this_00->m_lodBounds).m_data[0] = fVar19 - local_21c;
      fVar19 = TextureTestUtil::computeLodFromDerivates
                         (LODMODE_MAX_BOUND,(float)local_1e8._0_4_,0.0,local_1d0,0.0,
                          (float)local_1c8._0_4_,local_1cc);
      goto LAB_0062ded1;
    case TEXTURETYPE_CUBE_MAP:
    case TEXTURETYPE_CUBE_ARRAY:
      local_1b0._0_4_ = (this_00->m_minCoord).m_data[0];
      local_1b0._4_4_ = (this_00->m_minCoord).m_data[1];
      local_1a8._0_4_ = (this_00->m_minCoord).m_data[2];
      CVar21 = tcu::getCubeFaceCoords((Vec3 *)local_1b0);
      local_1e8._0_4_ = CVar21.t;
      local_1a8._0_4_ = (this_00->m_minCoord).m_data[2];
      local_1b0._4_4_ = (this_00->m_minCoord).m_data[1];
      local_1b0._0_4_ = (this_00->m_maxCoord).m_data[0];
      CVar22 = tcu::getCubeFaceCoords((Vec3 *)local_1b0);
      local_1b0._4_4_ = (this_00->m_maxCoord).m_data[1];
      local_1b0._0_4_ = (this_00->m_minCoord).m_data[0];
      local_1a8 = (SharedPtrStateBase *)CONCAT44(local_1a8._4_4_,(this_00->m_minCoord).m_data[2]);
      CVar23 = tcu::getCubeFaceCoords((Vec3 *)local_1b0);
      pTVar5 = (this_00->super_TextureQueryInstance).m_textureSpec;
      fVar20 = ((float)pTVar5->width * (CVar22.s - CVar21.s)) /
               (float)(uint)local_218._M_dataplus._M_p;
      fVar19 = ((float)pTVar5->height * (CVar23.t - (float)local_1e8._0_4_)) /
               (float)local_218._M_dataplus._M_p._4_4_;
      uVar18 = -(uint)(-fVar20 <= fVar20);
      fVar20 = (float)(~uVar18 & (uint)-fVar20 | (uint)fVar20 & uVar18);
      fVar20 = (float)(-(uint)(0.0 <= fVar20) & (uint)fVar20);
      uVar18 = -(uint)(-fVar19 <= fVar19);
      fVar19 = (float)(~uVar18 & (uint)-fVar19 | (uint)fVar19 & uVar18);
    }
    local_1e8 = ZEXT416((uint)fVar20);
    fVar19 = (float)(~-(uint)(fVar19 <= 0.0) & (uint)fVar19);
    local_1c8 = ZEXT416((uint)fVar19);
    fVar19 = logf((float)(~-(uint)(fVar19 <= fVar20) & (uint)fVar19 |
                         -(uint)(fVar19 <= fVar20) & (uint)fVar20));
    (this_00->m_lodBounds).m_data[0] = fVar19 * 1.442695 - local_21c;
    fVar19 = (float)local_1c8._0_4_ + (float)local_1e8._0_4_;
LAB_0062dec4:
    fVar19 = logf(fVar19);
    fVar19 = fVar19 * 1.442695;
LAB_0062ded1:
    (this_00->m_lodBounds).m_data[1] = local_21c + fVar19;
LAB_0062dee3:
    fVar19 = TextureQueryLodInstance::computeLevelFromLod(this_00,(this_00->m_lodBounds).m_data[0]);
    (this_00->m_levelBounds).m_data[0] = fVar19;
    fVar19 = TextureQueryLodInstance::computeLevelFromLod(this_00,(this_00->m_lodBounds).m_data[1]);
    (this_00->m_levelBounds).m_data[1] = fVar19;
    return (TestInstance *)this_00;
  case QUERYFUNCTION_TEXTUREQUERYLEVELS:
    pTVar9 = (TextureQueryInstance *)operator_new(0x230);
    TextureQueryInstance::TextureQueryInstance
              (pTVar9,context,(this->super_ShaderRenderCase).m_isVertexCase,&this->m_textureSpec);
    (pTVar9->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance =
         (_func_int **)&PTR__ShaderRenderCaseInstance_00d26ba8;
    *(undefined8 *)&pTVar9[1].super_ShaderRenderCaseInstance = 0;
    pTVar9[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context = (Context *)0x0;
    pTVar9[1].super_ShaderRenderCaseInstance.m_imageBackingMode = IMAGE_BACKING_MODE_REGULAR;
    pTVar9[1].super_ShaderRenderCaseInstance.m_quadGridSize = 0;
    break;
  case QUERYFUNCTION_TEXTURESAMPLES:
    pTVar9 = (TextureQueryInstance *)operator_new(0x238);
    TextureQueryInstance::TextureQueryInstance
              (pTVar9,context,(this->super_ShaderRenderCase).m_isVertexCase,&this->m_textureSpec);
    (pTVar9->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance =
         (_func_int **)&PTR__TextureSamplesInstance_00d26c08;
    *(undefined4 *)&pTVar9[1].super_ShaderRenderCaseInstance = 0;
    pTVar9[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context = (Context *)0x0;
    pTVar9[1].super_ShaderRenderCaseInstance.m_imageBackingMode = IMAGE_BACKING_MODE_REGULAR;
    pTVar9[1].super_ShaderRenderCaseInstance.m_quadGridSize = 0;
    *(undefined8 *)
     &pTVar9[1].super_ShaderRenderCaseInstance.m_sparseContext.
      super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
         = 0;
    *(undefined8 *)(pTVar9->super_ShaderRenderCaseInstance).m_renderSize.m_data = 0x100000001;
    local_1b0 = (undefined1  [8])glu::mapGLInternalFormat(pTVar9->m_textureSpec->format);
    format = ::vk::mapTextureFormat((TextureFormat *)local_1b0);
    uVar6 = pTVar9->m_textureSpec->type - TEXTURETYPE_2D;
    uVar16 = 0;
    if (uVar6 < 6) {
      uVar16 = *(uint *)(&DAT_00b2408c + (ulong)uVar6 * 4);
    }
    pIVar10 = Context::getInstanceInterface
                        ((pTVar9->super_ShaderRenderCaseInstance).super_TestInstance.m_context);
    pVVar11 = Context::getPhysicalDevice
                        ((pTVar9->super_ShaderRenderCaseInstance).super_TestInstance.m_context);
    iVar7 = (*pIVar10->_vptr_InstanceInterface[4])
                      (pIVar10,pVVar11,(ulong)format,(ulong)uVar16,0,6,(ulong)uVar18 << 0x20,
                       (TextureFormat *)local_1b0);
    if (iVar7 == -0xb) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,"Format not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRenderTextureFunctionTests.cpp"
                 ,0x7ca);
    }
    else {
      lVar17 = 0;
      do {
        if ((local_19c &
            *(VkSampleCountFlagBits *)
             ((long)&sr::(anonymous_namespace)::TextureSamplesInstance::
                     TextureSamplesInstance(vkt::Context&,bool,vkt::sr::(anonymous_namespace)::TextureSpec_const&)
                     ::sampleFlags + lVar17)) != 0) {
          __position._M_current =
               *(VkSampleCountFlagBits **)
                &pTVar9[1].super_ShaderRenderCaseInstance.m_imageBackingMode;
          if (__position._M_current ==
              *(VkSampleCountFlagBits **)
               &pTVar9[1].super_ShaderRenderCaseInstance.m_sparseContext.
                super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
             ) {
            std::vector<vk::VkSampleCountFlagBits,std::allocator<vk::VkSampleCountFlagBits>>::
            _M_realloc_insert<vk::VkSampleCountFlagBits_const&>
                      ((vector<vk::VkSampleCountFlagBits,std::allocator<vk::VkSampleCountFlagBits>>
                        *)&pTVar9[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context,
                       __position,
                       (VkSampleCountFlagBits *)
                       ((long)&sr::(anonymous_namespace)::TextureSamplesInstance::
                               TextureSamplesInstance(vkt::Context&,bool,vkt::sr::(anonymous_namespace)::TextureSpec_const&)
                               ::sampleFlags + lVar17));
          }
          else {
            *__position._M_current =
                 *(VkSampleCountFlagBits *)
                  ((long)&sr::(anonymous_namespace)::TextureSamplesInstance::
                          TextureSamplesInstance(vkt::Context&,bool,vkt::sr::(anonymous_namespace)::TextureSpec_const&)
                          ::sampleFlags + lVar17);
            *(VkSampleCountFlagBits **)&pTVar9[1].super_ShaderRenderCaseInstance.m_imageBackingMode
                 = __position._M_current + 1;
          }
        }
        lVar17 = lVar17 + 4;
      } while (lVar17 != 0x18);
      if (pTVar9[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context !=
          *(Context **)&pTVar9[1].super_ShaderRenderCaseInstance.m_imageBackingMode) {
LAB_0062d686:
        local_1b0 = (undefined1  [8])
                    ((pTVar9->super_ShaderRenderCaseInstance).super_TestInstance.m_context)->
                    m_testCtx->m_log;
        pTVar5 = pTVar9->m_textureSpec;
        local_1f4.m_data[0] = pTVar5->width;
        local_1f4.m_data[1] = pTVar5->height;
        local_1f4.m_data[2] = pTVar5->depth;
        pIVar15 = (IVec3 *)(ulong)(uint)local_1f4.m_data[2];
        local_238.m_ptr = (TextureBinding *)0x0;
        local_238.m_state = (SharedPtrStateBase *)0x0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Image size: ",0xc)
        ;
        sr::(anonymous_namespace)::getTextureSizeString_abi_cxx11_
                  (&local_218,(_anonymous_namespace_ *)(ulong)pTVar9->m_textureSpec->type,
                   (TextureType)&local_1f4,pIVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,
                   (char *)CONCAT44(local_218._M_dataplus._M_p._4_4_,
                                    (uint)local_218._M_dataplus._M_p),local_218._M_string_length);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_218._M_dataplus._M_p._4_4_,(uint)local_218._M_dataplus._M_p) !=
            &local_218.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_218._M_dataplus._M_p._4_4_,(uint)local_218._M_dataplus._M_p
                                  ),local_218.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        pTVar5 = pTVar9->m_textureSpec;
        createEmptyTexture((anon_unknown_0 *)local_1b0,pTVar5->format,pTVar5->type,&local_1f4,
                           pTVar5->numLevels,0,&pTVar5->sampler);
        if (local_238.m_state != local_1a8) {
          if (local_238.m_state != (SharedPtrStateBase *)0x0) {
            LOCK();
            pdVar1 = &(local_238.m_state)->strongRefCount;
            *pdVar1 = *pdVar1 + -1;
            UNLOCK();
            if (*pdVar1 == 0) {
              local_238.m_ptr = (TextureBinding *)0x0;
              (*(local_238.m_state)->_vptr_SharedPtrStateBase[2])();
            }
            LOCK();
            pdVar1 = &(local_238.m_state)->weakRefCount;
            *pdVar1 = *pdVar1 + -1;
            UNLOCK();
            if ((*pdVar1 == 0) && (local_238.m_state != (SharedPtrStateBase *)0x0)) {
              (*(local_238.m_state)->_vptr_SharedPtrStateBase[1])();
            }
          }
          local_238.m_ptr = (TextureBinding *)local_1b0;
          local_238.m_state = local_1a8;
          if (local_1a8 != (SharedPtrStateBase *)0x0) {
            LOCK();
            local_1a8->strongRefCount = local_1a8->strongRefCount + 1;
            UNLOCK();
            LOCK();
            local_1a8->weakRefCount = local_1a8->weakRefCount + 1;
            UNLOCK();
          }
        }
        if (local_1a8 != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = &local_1a8->strongRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            local_1b0._0_4_ = R;
            local_1b0._4_4_ = SNORM_INT8;
            (*local_1a8->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar1 = &local_1a8->weakRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            if (local_1a8 != (SharedPtrStateBase *)0x0) {
              (*local_1a8->_vptr_SharedPtrStateBase[1])();
            }
            local_1a8 = (SharedPtrStateBase *)0x0;
          }
        }
        std::
        vector<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
        ::push_back(&(pTVar9->super_ShaderRenderCaseInstance).m_textures,&local_238);
        if (local_238.m_state == (SharedPtrStateBase *)0x0) {
          return (TestInstance *)pTVar9;
        }
        LOCK();
        pdVar1 = &(local_238.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_238.m_ptr = (TextureBinding *)0x0;
          (*(local_238.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_238.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 != 0) {
          return (TestInstance *)pTVar9;
        }
        if (local_238.m_state == (SharedPtrStateBase *)0x0) {
          return (TestInstance *)pTVar9;
        }
        (*(local_238.m_state)->_vptr_SharedPtrStateBase[1])();
        return (TestInstance *)pTVar9;
      }
      TVar12 = ::vk::mapVkFormat(format);
      TVar8 = tcu::getTextureChannelClass(TVar12.type);
      if (TVar8 != TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
        TVar12 = ::vk::mapVkFormat(format);
        TVar8 = tcu::getTextureChannelClass(TVar12.type);
        if (TVar8 != TEXTURECHANNELCLASS_SIGNED_INTEGER) goto LAB_0062d686;
      }
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,
                 "Skipping validation of integer formats as only VK_SAMPLE_COUNT_1_BIT is supported."
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRenderTextureFunctionTests.cpp"
                 ,0x7f2);
    }
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  default:
    return (TestInstance *)0x0;
  }
  *(undefined8 *)(pTVar9->super_ShaderRenderCaseInstance).m_renderSize.m_data = 0x100000001;
  return (TestInstance *)pTVar9;
}

Assistant:

TestInstance* TextureQueryCase::createInstance (Context& context) const
{
	switch (m_function)
	{
		case QUERYFUNCTION_TEXTURESIZE:				return new TextureSizeInstance(context, m_isVertexCase, m_textureSpec);
		case QUERYFUNCTION_TEXTUREQUERYLOD:			return new TextureQueryLodInstance(context, m_isVertexCase, m_textureSpec);
		case QUERYFUNCTION_TEXTUREQUERYLEVELS:		return new TextureQueryLevelsInstance(context, m_isVertexCase, m_textureSpec);
		case QUERYFUNCTION_TEXTURESAMPLES:			return new TextureSamplesInstance(context, m_isVertexCase, m_textureSpec);
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}